

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O1

void gen_spr_970_pmu_user(CPUPPCState_conflict2 *env)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  if ((((env->spr_cb[0x309].name == (char *)0x0) && (env->spr[0x309] == 0)) &&
      (env->spr_cb[0x309].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
     (((env->spr_cb[0x309].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
       (env->spr_cb[0x309].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
      (env->spr_cb[0x309].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
    env->spr_cb[0x309].name = "UPMC7";
    env->spr_cb[0x309].uea_read = spr_read_ureg;
    env->spr_cb[0x309].uea_write = spr_noaccess;
    env->spr_cb[0x309].oea_read = spr_read_ureg;
    env->spr_cb[0x309].oea_write = spr_write_ureg;
    env->spr_cb[0x309].hea_read = spr_read_ureg;
    env->spr_cb[0x309].hea_write = spr_write_ureg;
    env->spr_cb[0x309].default_value = 0;
    env->spr[0x309] = 0;
    if (((env->spr_cb[0x30a].name == (char *)0x0) && (env->spr[0x30a] == 0)) &&
       ((env->spr_cb[0x30a].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
        (((env->spr_cb[0x30a].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
          (env->spr_cb[0x30a].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
         (env->spr_cb[0x30a].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
      env->spr_cb[0x30a].name = "UPMC8";
      env->spr_cb[0x30a].uea_read = spr_read_ureg;
      env->spr_cb[0x30a].uea_write = spr_noaccess;
      env->spr_cb[0x30a].oea_read = spr_read_ureg;
      env->spr_cb[0x30a].oea_write = spr_write_ureg;
      env->spr_cb[0x30a].hea_read = spr_read_ureg;
      env->spr_cb[0x30a].hea_write = spr_write_ureg;
      env->spr_cb[0x30a].default_value = 0;
      env->spr[0x30a] = 0;
      return;
    }
    uVar2 = 0x30a;
    uVar1 = 0x30a;
  }
  else {
    uVar2 = 0x309;
    uVar1 = 0x309;
  }
  printf("Error: Trying to register SPR %d (%03x) twice !\n",uVar2,uVar1);
  exit(1);
}

Assistant:

static void gen_spr_970_pmu_user(CPUPPCState *env)
{
    spr_register(env, SPR_970_UPMC7, "UPMC7",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, &spr_write_ureg,
                 0x00000000);
    spr_register(env, SPR_970_UPMC8, "UPMC8",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, &spr_write_ureg,
                 0x00000000);
}